

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  string *psVar1;
  string local_90;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  if ((gen->ConfiguredFilesPath)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->ConfiguredFilesPath);
    return;
  }
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(gen->CMakeInstance);
  local_40.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_40.View_._M_len = psVar1->_M_string_length;
  local_70.View_._M_len = 0xb;
  local_70.View_._M_str = "/CMakeFiles";
  cmStrCat<>(&local_90,&local_40,&local_70);
  std::__cxx11::string::operator=((string *)&this->ConfiguredFilesPath,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if (!gen->ConfiguredFilesPath.empty()) {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
  } else {
    this->ConfiguredFilesPath =
      cmStrCat(gen->CMakeInstance->GetHomeOutputDirectory(), "/CMakeFiles");
  }
}